

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageLiteGenerator::GenerateConstructor
          (ImmutableMessageLiteGenerator *this,Printer *printer)

{
  Printer *in_RDI;
  ImmutableMessageLiteGenerator *unaff_retaddr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000028;
  Printer *in_stack_00000030;
  char *in_stack_00000038;
  Printer *in_stack_00000040;
  
  Descriptor::name_abi_cxx11_((Descriptor *)in_RDI->output_);
  io::Printer::Print<char[10],std::__cxx11::string>
            (in_stack_00000040,in_stack_00000038,&in_stack_00000030->variable_delimiter_,
             in_stack_00000028);
  io::Printer::Indent((Printer *)0x549f70);
  GenerateInitializers(unaff_retaddr,in_RDI);
  io::Printer::Outdent(in_stack_00000040);
  io::Printer::Print<>(in_stack_00000030,(char *)in_stack_00000028);
  return;
}

Assistant:

void ImmutableMessageLiteGenerator::GenerateConstructor(io::Printer* printer) {
  printer->Print("private $classname$() {\n", "classname", descriptor_->name());
  printer->Indent();

  // Initialize all fields to default.
  GenerateInitializers(printer);

  printer->Outdent();
  printer->Print("}\n");
}